

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.h
# Opt level: O2

void __thiscall
CVmSrcfEntry::CVmSrcfEntry(CVmSrcfEntry *this,int orig_index,int is_orig,size_t name_len)

{
  char *pcVar1;
  
  this->lines_alo_ = 0;
  this->lines_ = (CVmSrcfLine *)0x0;
  this->lines_cnt_ = 0;
  this->orig_index_ = orig_index;
  this->field_0xc = this->field_0xc & 0xfe | (byte)is_orig & 1;
  pcVar1 = (char *)malloc(name_len + 1);
  this->name_buf_ = pcVar1;
  return;
}

Assistant:

CVmSrcfEntry(int orig_index, int is_orig, size_t name_len)
    {
        /* no source lines yet */
        lines_ = 0;
        lines_cnt_ = lines_alo_ = 0;

        /* set the original index */
        orig_index_ = orig_index;

        /* remember whether this is the master entry */
        is_orig_ = is_orig;

        /* allocate space for our name buffer */
        name_buf_ = (char *)t3malloc(name_len + 1);
    }